

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node>::clear
          (vector<basisu::tree_vector_quant<basisu::vec<16U,_float>_>::tsvq_node> *this)

{
  if (this->m_p != (tsvq_node *)0x0) {
    destruct_array<basisu::tree_vector_quant<basisu::vec<16u,float>>::tsvq_node>
              (this->m_p,(ulong)this->m_size);
    free(this->m_p);
    this->m_p = (tsvq_node *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }